

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

uint32_t net_uv::net_getBufHash(void *buf,uint32_t len)

{
  char *local_28;
  char *str;
  uint32_t i;
  uint32_t hash;
  uint32_t seed;
  uint32_t len_local;
  void *buf_local;
  
  str._4_4_ = 0;
  local_28 = (char *)buf;
  for (str._0_4_ = 0; (uint)str < len; str._0_4_ = (uint)str + 1) {
    str._4_4_ = str._4_4_ * 0x83 + (int)*local_28;
    local_28 = local_28 + 1;
  }
  return str._4_4_ & 0x7fffffff;
}

Assistant:

uint32_t net_getBufHash(const void *buf, uint32_t len)
{
	uint32_t seed = 131; // 31 131 1313 13131 131313 etc..
	uint32_t hash = 0;
	uint32_t i = 0;
	char *str = (char *)buf;
	while (i < len)
	{
		hash = hash * seed + (*str++);
		++i;
	}

	return (hash & 0x7FFFFFFF);
}